

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O0

void __thiscall
ExchangeCompilation_MissingDefinitions_Test::ExchangeCompilation_MissingDefinitions_Test
          (ExchangeCompilation_MissingDefinitions_Test *this)

{
  ExchangeCompilation_MissingDefinitions_Test *this_local;
  
  anon_unknown.dwarf_944bc::ExchangeCompilation::ExchangeCompilation
            (&this->super_ExchangeCompilation);
  (this->super_ExchangeCompilation).super_Test._vptr_Test =
       (_func_int **)&PTR__ExchangeCompilation_MissingDefinitions_Test_003ef0a8;
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingDefinitions) {
    auto const names = R"([ "triple" ])"s;
    auto const compilation = R"({ "triple": 0 })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});
    auto name_parser = import_strings_parser (&transaction, &imported_names);
    name_parser.input (names).eof ();
    ASSERT_FALSE (name_parser.has_error ())
        << "JSON error was: " << name_parser.last_error ().message () << ' '
        << name_parser.coordinate () << '\n'
        << names;

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}